

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_resolve_module(JSContext *ctx,JSModuleDef *m)

{
  JSRuntime *pJVar1;
  int iVar2;
  JSModuleDef *pJVar3;
  long lVar4;
  JSContext *in_RSI;
  JSReqModuleEntry *rme;
  JSModuleDef *m1;
  int i;
  JSAtom in_stack_ffffffffffffffe0;
  JSAtom base_module_name;
  
  if ((char)(in_RSI->regexp_ctor).tag == '\0') {
    (in_RSI->regexp_ctor).tag = (in_RSI->regexp_ctor).tag & 0xffffffffffffff00U | 1;
    for (base_module_name = 0; (int)base_module_name < *(int *)&(in_RSI->link).prev;
        base_module_name = base_module_name + 1) {
      pJVar1 = in_RSI->rt;
      lVar4 = (long)(int)base_module_name;
      pJVar3 = js_host_resolve_imported_module_atom
                         (in_RSI,base_module_name,in_stack_ffffffffffffffe0);
      if (pJVar3 == (JSModuleDef *)0x0) {
        return -1;
      }
      (&(pJVar1->mf).js_free)[lVar4 * 2] = (_func_void_JSMallocState_ptr_void_ptr *)pJVar3;
      iVar2 = js_resolve_module(in_RSI,(JSModuleDef *)
                                       CONCAT44(base_module_name,in_stack_ffffffffffffffe0));
      if (iVar2 < 0) {
        return -1;
      }
    }
  }
  return 0;
}

Assistant:

static int js_resolve_module(JSContext *ctx, JSModuleDef *m)
{
    int i;
    JSModuleDef *m1;

    if (m->resolved)
        return 0;
#ifdef DUMP_MODULE_RESOLVE
    {
        char buf1[ATOM_GET_STR_BUF_SIZE];
        printf("resolving module '%s':\n", JS_AtomGetStr(ctx, buf1, sizeof(buf1), m->module_name));
    }
#endif
    m->resolved = TRUE;
    /* resolve each requested module */
    for(i = 0; i < m->req_module_entries_count; i++) {
        JSReqModuleEntry *rme = &m->req_module_entries[i];
        m1 = js_host_resolve_imported_module_atom(ctx, m->module_name,
                                                  rme->module_name);
        if (!m1)
            return -1;
        rme->module = m1;
        /* already done in js_host_resolve_imported_module() except if
           the module was loaded with JS_EvalBinary() */
        if (js_resolve_module(ctx, m1) < 0)
            return -1;
    }
    return 0;
}